

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall
SPTest_VarInExpectation_Test::~SPTest_VarInExpectation_Test(SPTest_VarInExpectation_Test *this)

{
  void *in_RDI;
  
  ~SPTest_VarInExpectation_Test((SPTest_VarInExpectation_Test *)0x128d78);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SPTest, VarInExpectation) {
  TestBasicProblem p(10);
  p.AddExpectationObj(p.MakeVariable(7));
  mp::SPAdapter sp(p);
  auto obj = sp.obj(0);
  auto expr = obj.linear_expr();
  EXPECT_EQ(1, expr.num_terms());
  auto term = *expr.begin();
  EXPECT_EQ(7, term.var_index());
  EXPECT_EQ(1, term.coef());
  EXPECT_EQ(mp::NumericExpr(), obj.nonlinear_expr());
}